

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O3

void xmlRelaxNGFreeGrammar(xmlRelaxNGGrammarPtr_conflict grammar)

{
  if (grammar->children != (xmlRelaxNGGrammarPtr_conflict)0x0) {
    xmlRelaxNGFreeGrammar(grammar->children);
  }
  if (grammar->next != (xmlRelaxNGGrammarPtr_conflict)0x0) {
    xmlRelaxNGFreeGrammar(grammar->next);
  }
  if (grammar->refs != (xmlHashTablePtr)0x0) {
    xmlHashFree(grammar->refs,(xmlHashDeallocator)0x0);
  }
  if (grammar->defs != (xmlHashTablePtr)0x0) {
    xmlHashFree(grammar->defs,(xmlHashDeallocator)0x0);
  }
  (*xmlFree)(grammar);
  return;
}

Assistant:

static void
xmlRelaxNGFreeGrammar(xmlRelaxNGGrammarPtr grammar)
{
    if (grammar == NULL)
        return;

    if (grammar->children != NULL) {
        xmlRelaxNGFreeGrammar(grammar->children);
    }
    if (grammar->next != NULL) {
        xmlRelaxNGFreeGrammar(grammar->next);
    }
    if (grammar->refs != NULL) {
        xmlHashFree(grammar->refs, NULL);
    }
    if (grammar->defs != NULL) {
        xmlHashFree(grammar->defs, NULL);
    }

    xmlFree(grammar);
}